

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

void __thiscall adios2::core::ADIOS::ADIOS(ADIOS *this,string *hostLanguage)

{
  string *in_RSI;
  string *in_stack_00000268;
  Comm *in_stack_00000270;
  string *in_stack_00000278;
  ADIOS *in_stack_00000280;
  string local_70 [63];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  helper::CommDummy();
  std::__cxx11::string::string(local_70,in_RSI);
  ADIOS(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  std::__cxx11::string::~string(local_70);
  helper::Comm::~Comm((Comm *)0x8447e7);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

ADIOS::ADIOS(const std::string hostLanguage) : ADIOS("", helper::CommDummy(), hostLanguage) {}